

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cache.c
# Opt level: O1

int mbedtls_ssl_cache_set(void *data,mbedtls_ssl_session *session)

{
  int iVar1;
  mbedtls_x509_crt *pmVar2;
  size_t __size;
  int iVar3;
  time_t tVar4;
  long *plVar5;
  void *__dest;
  long *plVar6;
  long lVar7;
  long *plVar8;
  int iVar9;
  bool bVar10;
  long *local_50;
  
  tVar4 = time((time_t *)0x0);
  plVar5 = *data;
  bVar10 = plVar5 == (long *)0x0;
  if (bVar10) {
    local_50 = (long *)0x0;
    iVar9 = 0;
    plVar6 = (long *)0x0;
  }
  else {
    iVar1 = *(int *)((long)data + 8);
    local_50 = (long *)0x0;
    lVar7 = 0;
    plVar6 = (long *)0x0;
    plVar8 = plVar5;
    iVar3 = 1;
    do {
      iVar9 = iVar3;
      plVar5 = plVar8;
      if ((iVar1 != 0) && (iVar1 < (int)tVar4 - (int)*plVar8)) {
        *plVar8 = tVar4;
        break;
      }
      iVar3 = bcmp(session->id,plVar8 + 4,plVar8[3]);
      if (iVar3 == 0) break;
      if ((lVar7 == 0) || (*plVar8 < lVar7)) {
        lVar7 = *plVar8;
        local_50 = plVar8;
      }
      plVar5 = (long *)plVar8[0x17];
      bVar10 = plVar5 == (long *)0x0;
      plVar6 = plVar8;
      plVar8 = plVar5;
      iVar3 = iVar9 + 1;
    } while (!bVar10);
  }
  if (bVar10) {
    if (iVar9 < *(int *)((long)data + 0xc)) {
      local_50 = (long *)calloc(1,0xc0);
      if (local_50 == (long *)0x0) {
        return 1;
      }
      plVar5 = plVar6 + 0x17;
      if (plVar6 == (long *)0x0) {
        plVar5 = (long *)data;
      }
      *plVar5 = (long)local_50;
    }
    else if (local_50 == (long *)0x0) {
      return 1;
    }
    *local_50 = tVar4;
    plVar5 = local_50;
  }
  memcpy(plVar5 + 1,session,0x98);
  if ((void *)plVar5[0x16] != (void *)0x0) {
    free((void *)plVar5[0x16]);
    plVar5[0x14] = 0;
    plVar5[0x15] = 0;
    plVar5[0x16] = 0;
  }
  pmVar2 = session->peer_cert;
  if (pmVar2 != (mbedtls_x509_crt *)0x0) {
    __size = (pmVar2->raw).len;
    __dest = calloc(1,__size);
    plVar5[0x16] = (long)__dest;
    if (__dest == (void *)0x0) {
      return 1;
    }
    memcpy(__dest,(pmVar2->raw).p,__size);
    plVar5[0x15] = (pmVar2->raw).len;
    plVar5[0xe] = 0;
    return 0;
  }
  return 0;
}

Assistant:

int mbedtls_ssl_cache_set( void *data, const mbedtls_ssl_session *session )
{
    int ret = 1;
#if defined(MBEDTLS_HAVE_TIME)
    mbedtls_time_t t = mbedtls_time( NULL ), oldest = 0;
    mbedtls_ssl_cache_entry *old = NULL;
#endif
    mbedtls_ssl_cache_context *cache = (mbedtls_ssl_cache_context *) data;
    mbedtls_ssl_cache_entry *cur, *prv;
    int count = 0;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &cache->mutex ) ) != 0 )
        return( ret );
#endif

    cur = cache->chain;
    prv = NULL;

    while( cur != NULL )
    {
        count++;

#if defined(MBEDTLS_HAVE_TIME)
        if( cache->timeout != 0 &&
            (int) ( t - cur->timestamp ) > cache->timeout )
        {
            cur->timestamp = t;
            break; /* expired, reuse this slot, update timestamp */
        }
#endif

        if( memcmp( session->id, cur->session.id, cur->session.id_len ) == 0 )
            break; /* client reconnected, keep timestamp for session id */

#if defined(MBEDTLS_HAVE_TIME)
        if( oldest == 0 || cur->timestamp < oldest )
        {
            oldest = cur->timestamp;
            old = cur;
        }
#endif

        prv = cur;
        cur = cur->next;
    }

    if( cur == NULL )
    {
#if defined(MBEDTLS_HAVE_TIME)
        /*
         * Reuse oldest entry if max_entries reached
         */
        if( count >= cache->max_entries )
        {
            if( old == NULL )
            {
                ret = 1;
                goto exit;
            }

            cur = old;
        }
#else /* MBEDTLS_HAVE_TIME */
        /*
         * Reuse first entry in chain if max_entries reached,
         * but move to last place
         */
        if( count >= cache->max_entries )
        {
            if( cache->chain == NULL )
            {
                ret = 1;
                goto exit;
            }

            cur = cache->chain;
            cache->chain = cur->next;
            cur->next = NULL;
            prv->next = cur;
        }
#endif /* MBEDTLS_HAVE_TIME */
        else
        {
            /*
             * max_entries not reached, create new entry
             */
            cur = mbedtls_calloc( 1, sizeof(mbedtls_ssl_cache_entry) );
            if( cur == NULL )
            {
                ret = 1;
                goto exit;
            }

            if( prv == NULL )
                cache->chain = cur;
            else
                prv->next = cur;
        }

#if defined(MBEDTLS_HAVE_TIME)
        cur->timestamp = t;
#endif
    }